

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void suboption(Curl_easy *data)

{
  uchar uVar1;
  TELNET *pTVar2;
  connectdata *pcVar3;
  uchar *puVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  ssize_t sVar8;
  uint *puVar9;
  size_t vlen;
  char *s;
  size_t tmplen;
  connectdata *conn;
  TELNET *tn;
  size_t sStack_828;
  int err;
  size_t len;
  ssize_t bytes_written;
  uchar temp [2048];
  curl_slist *v;
  Curl_easy *data_local;
  
  pTVar2 = (data->req).p.telnet;
  pcVar3 = data->conn;
  printsub(data,0x3c,pTVar2->subbuffer,(size_t)(pTVar2->subend + (2 - (long)pTVar2->subpointer)));
  puVar4 = pTVar2->subpointer;
  pTVar2->subpointer = puVar4 + 1;
  uVar1 = *puVar4;
  if (uVar1 == '\x18') {
    sVar6 = strlen(pTVar2->subopt_ttype);
    curl_msnprintf((char *)&bytes_written,0x800,"%c%c%c%c%s%c%c",0xff,0xfa,0x18,0,
                   pTVar2->subopt_ttype,0xff,0xf0);
    sVar8 = send(pcVar3->sock[0],&bytes_written,sVar6 + 6,0x4000);
    if (sVar8 < 0) {
      puVar9 = (uint *)__errno_location();
      Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar9);
    }
    printsub(data,0x3e,(uchar *)((long)&bytes_written + 2),sVar6 + 4);
  }
  else if (uVar1 == '#') {
    sVar6 = strlen(pTVar2->subopt_xdisploc);
    curl_msnprintf((char *)&bytes_written,0x800,"%c%c%c%c%s%c%c",0xff,0xfa,0x23,0,
                   pTVar2->subopt_xdisploc,0xff,0xf0);
    sVar8 = send(pcVar3->sock[0],&bytes_written,sVar6 + 6,0x4000);
    if (sVar8 < 0) {
      puVar9 = (uint *)__errno_location();
      Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar9);
    }
    printsub(data,0x3e,(uchar *)((long)&bytes_written + 2),sVar6 + 4);
  }
  else if (uVar1 == '\'') {
    curl_msnprintf((char *)&bytes_written,0x800,"%c%c%c%c",0xff,0xfa,0x27,0);
    sStack_828 = 4;
    for (temp._2040_8_ = pTVar2->telnet_vars; temp._2040_8_ != 0;
        temp._2040_8_ = *(undefined8 *)(temp._2040_8_ + 8)) {
      sVar6 = strlen(*(char **)temp._2040_8_);
      if (sStack_828 + sVar6 + 1 < 0x7fa) {
        pcVar7 = strchr(*(char **)temp._2040_8_,0x2c);
        if (pcVar7 == (char *)0x0) {
          iVar5 = curl_msnprintf((char *)(temp + (sStack_828 - 8)),0x800 - sStack_828,"%c%s",0,
                                 *(undefined8 *)temp._2040_8_);
        }
        else {
          iVar5 = curl_msnprintf((char *)(temp + (sStack_828 - 8)),0x800 - sStack_828,"%c%.*s%c%s",0
                                 ,(long)pcVar7 - *(long *)temp._2040_8_ & 0xffffffff,
                                 *(undefined8 *)temp._2040_8_,1,pcVar7 + 1);
        }
        sStack_828 = (long)iVar5 + sStack_828;
      }
    }
    curl_msnprintf((char *)(temp + (sStack_828 - 8)),0x800 - sStack_828,"%c%c",0xff,0xf0);
    sVar8 = send(pcVar3->sock[0],&bytes_written,sStack_828 + 2,0x4000);
    if (sVar8 < 0) {
      puVar9 = (uint *)__errno_location();
      Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar9);
    }
    printsub(data,0x3e,(uchar *)((long)&bytes_written + 2),sStack_828);
  }
  return;
}

Assistant:

static void suboption(struct Curl_easy *data)
{
  struct curl_slist *v;
  unsigned char temp[2048];
  ssize_t bytes_written;
  size_t len;
  int err;
  struct TELNET *tn = data->req.p.telnet;
  struct connectdata *conn = data->conn;

  printsub(data, '<', (unsigned char *)tn->subbuffer, CURL_SB_LEN(tn) + 2);
  switch(CURL_SB_GET(tn)) {
    case CURL_TELOPT_TTYPE:
      len = strlen(tn->subopt_ttype) + 4 + 2;
      msnprintf((char *)temp, sizeof(temp),
                "%c%c%c%c%s%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_TTYPE,
                CURL_TELQUAL_IS, tn->subopt_ttype, CURL_IAC, CURL_SE);
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
    case CURL_TELOPT_XDISPLOC:
      len = strlen(tn->subopt_xdisploc) + 4 + 2;
      msnprintf((char *)temp, sizeof(temp),
                "%c%c%c%c%s%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_XDISPLOC,
                CURL_TELQUAL_IS, tn->subopt_xdisploc, CURL_IAC, CURL_SE);
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
    case CURL_TELOPT_NEW_ENVIRON:
      msnprintf((char *)temp, sizeof(temp),
                "%c%c%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_NEW_ENVIRON,
                CURL_TELQUAL_IS);
      len = 4;

      for(v = tn->telnet_vars; v; v = v->next) {
        size_t tmplen = (strlen(v->data) + 1);
        /* Add the variable if it fits */
        if(len + tmplen < (int)sizeof(temp)-6) {
          char *s = strchr(v->data, ',');
          if(!s)
            len += msnprintf((char *)&temp[len], sizeof(temp) - len,
                             "%c%s", CURL_NEW_ENV_VAR, v->data);
          else {
            size_t vlen = s - v->data;
            len += msnprintf((char *)&temp[len], sizeof(temp) - len,
                             "%c%.*s%c%s", CURL_NEW_ENV_VAR,
                             (int)vlen, v->data, CURL_NEW_ENV_VALUE, ++s);
          }
        }
      }
      msnprintf((char *)&temp[len], sizeof(temp) - len,
                "%c%c", CURL_IAC, CURL_SE);
      len += 2;
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
  }
  return;
}